

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dds_comp.cpp
# Opt level: O1

void __thiscall crnlib::dds_comp::clear(dds_comp *this)

{
  uchar *p;
  qdxt_state *p_00;
  dxt_pixel_block *p_01;
  
  mipmapped_texture::clear(&this->m_src_tex);
  mipmapped_texture::clear(&this->m_packed_tex);
  p = (this->m_comp_data).m_p;
  if (p != (uchar *)0x0) {
    crnlib_free(p);
    (this->m_comp_data).m_p = (uchar *)0x0;
    (this->m_comp_data).m_size = 0;
    (this->m_comp_data).m_capacity = 0;
  }
  this->m_pParams = (crn_comp_params *)0x0;
  this->m_pixel_fmt = PIXEL_FMT_INVALID;
  task_pool::deinit(&this->m_task_pool);
  p_00 = this->m_pQDXT_state;
  if (p_00 != (qdxt_state *)0x0) {
    p_01 = (p_00->m_pixel_blocks).m_p;
    if (p_01 != (dxt_pixel_block *)0x0) {
      crnlib_free(p_01);
    }
    qdxt5::~qdxt5(&p_00->m_qdxt5b);
    qdxt5::~qdxt5(&p_00->m_qdxt5a);
    qdxt1::~qdxt1(&p_00->m_qdxt1);
    crnlib_free(p_00);
    this->m_pQDXT_state = (qdxt_state *)0x0;
  }
  return;
}

Assistant:

void dds_comp::clear() {
  m_src_tex.clear();
  m_packed_tex.clear();
  m_comp_data.clear();
  m_pParams = NULL;
  m_pixel_fmt = PIXEL_FMT_INVALID;
  m_task_pool.deinit();
  if (m_pQDXT_state) {
    crnlib_delete(m_pQDXT_state);
    m_pQDXT_state = NULL;
  }
}